

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O1

MPP_RET mpp_service_rcb_info(void *ctx,MppDevRcbInfoCfg *cfg)

{
  RcbInfo *pRVar1;
  MPP_RET MVar2;
  
  MVar2 = MPP_OK;
  if (*(int *)((long)ctx + 0x18c) != 0) {
    if (*(int *)((long)ctx + 0x5c) < 0x20) {
      pRVar1 = mpp_service_next_rcb_info((MppDevMppService *)ctx);
      pRVar1->reg_idx = cfg->reg_idx;
      pRVar1->size = cfg->size;
      MVar2 = MPP_OK;
    }
    else {
      _mpp_log_l(2,"mpp_serivce","reach max offset definition\n","mpp_service_rcb_info",0x20);
      MVar2 = MPP_NOK;
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_service_rcb_info(void *ctx, MppDevRcbInfoCfg *cfg)
{
    MppDevMppService *p = (MppDevMppService *)ctx;

    if (!p->support_set_rcb_info)
        return MPP_OK;

    if (p->rcb_count >= MAX_RCB_OFFSET) {
        mpp_err_f("reach max offset definition\n", MAX_RCB_OFFSET);
        return MPP_NOK;
    }

    RcbInfo *info = mpp_service_next_rcb_info(p);

    info->reg_idx = cfg->reg_idx;
    info->size = cfg->size;

    return MPP_OK;
}